

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_arith(lua_State *L,int op)

{
  ushort uVar1;
  int iVar2;
  GCObject *pGVar3;
  int *piVar4;
  long lVar5;
  StkId pTVar6;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x14d,"void lua_arith(lua_State *, int)");
  }
  pTVar6 = L->top;
  lVar5 = (long)pTVar6 - (long)L->ci->func;
  if (op - 0xeU < 0xfffffffe) {
    if (lVar5 < 0x21) {
      __assert_fail("((2) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x14f,"void lua_arith(lua_State *, int)");
    }
  }
  else {
    if (lVar5 < 0x11) {
      __assert_fail("((1) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x151,"void lua_arith(lua_State *, int)");
    }
    pGVar3 = pTVar6[-1].value_.gc;
    (pTVar6->value_).gc = pGVar3;
    uVar1 = pTVar6[-1].tt_;
    pTVar6->tt_ = uVar1;
    if (((short)uVar1 < 0) &&
       (((uVar1 & 0x7f) != (ushort)pGVar3->tt ||
        ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x152,"void lua_arith(lua_State *, int)");
    }
    pTVar6 = L->top + 1;
    L->top = pTVar6;
    if (L->ci->top < pTVar6) {
      __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x153,"void lua_arith(lua_State *, int)");
    }
  }
  luaO_arith(L,op,pTVar6 + -2,pTVar6 + -1,pTVar6 + -2);
  L->top = L->top + -1;
  piVar4 = *(int **)&L[-1].hookmask;
  *piVar4 = *piVar4 + -1;
  if (*piVar4 == 0) {
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x158,"void lua_arith(lua_State *, int)");
}

Assistant:

LUA_API void lua_arith (lua_State *L, int op) {
  lua_lock(L);
  if (op != LUA_OPUNM && op != LUA_OPBNOT)
    api_checknelems(L, 2);  /* all other operations expect two operands */
  else {  /* for unary operations, add fake 2nd operand */
    api_checknelems(L, 1);
    setobjs2s(L, L->top, L->top - 1);
    api_incr_top(L);
  }
  /* first operand at top - 2, second at top - 1; result go to top - 2 */
  luaO_arith(L, op, L->top - 2, L->top - 1, L->top - 2);
  L->top--;  /* remove second operand */
  lua_unlock(L);
}